

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_task_manager.hpp
# Opt level: O2

idx_t __thiscall
duckdb::BatchTaskManager<duckdb::BatchCopyTask>::TaskCount
          (BatchTaskManager<duckdb::BatchCopyTask> *this)

{
  size_type sVar1;
  
  ::std::mutex::lock(&this->task_lock);
  sVar1 = ::std::
          deque<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
          ::size(&(this->task_queue).c);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar1;
}

Assistant:

idx_t TaskCount() {
		lock_guard<mutex> l(task_lock);
		return task_queue.size();
	}